

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

bool __thiscall ON_HatchLine::operator!=(ON_HatchLine *this,ON_HatchLine *src)

{
  bool bVar1;
  double *pdVar2;
  double *pdVar3;
  bool local_19;
  ON_HatchLine *src_local;
  ON_HatchLine *this_local;
  
  local_19 = true;
  if ((this->m_angle_radians == src->m_angle_radians) &&
     (!NAN(this->m_angle_radians) && !NAN(src->m_angle_radians))) {
    bVar1 = ON_2dPoint::operator!=(&this->m_base,&src->m_base);
    local_19 = true;
    if (!bVar1) {
      bVar1 = ON_2dVector::operator!=(&this->m_offset,&src->m_offset);
      local_19 = true;
      if (!bVar1) {
        pdVar2 = ::ON_SimpleArray::operator_cast_to_double_((ON_SimpleArray *)&this->m_dashes);
        pdVar3 = ::ON_SimpleArray::operator_cast_to_double_((ON_SimpleArray *)&src->m_dashes);
        local_19 = pdVar2 != pdVar3;
      }
    }
  }
  return local_19;
}

Assistant:

bool ON_HatchLine::operator!=(const ON_HatchLine& src) const
{
  return(
    m_angle_radians != src.m_angle_radians
    || m_base != src.m_base
    || m_offset != src.m_offset
    || m_dashes != src.m_dashes
    );
}